

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::EarlyCastFinder
          (EarlyCastFinder *this,PassOptions *options,Module *module,Function *func)

{
  allocator<wasm::(anonymous_namespace)::RefCastInfo> *this_00;
  allocator<wasm::(anonymous_namespace)::RefAsInfo> *this_01;
  size_t sVar1;
  undefined1 local_70 [8];
  RefAs dummyRefAs;
  RefCast dummyRefCast;
  Function *func_local;
  Module *module_local;
  PassOptions *options_local;
  EarlyCastFinder *this_local;
  
  LinearExecutionWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
  ::LinearExecutionWalker
            (&this->
              super_LinearExecutionWalker<wasm::(anonymous_namespace)::EarlyCastFinder,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::EarlyCastFinder,_void>_>
            );
  PassOptions::PassOptions(&this->options,options);
  sVar1 = Function::getNumLocals(func);
  this->numLocals = sVar1;
  sVar1 = Function::getNumLocals(func);
  this_00 = (allocator<wasm::(anonymous_namespace)::RefCastInfo> *)((long)&dummyRefCast.ref + 3);
  std::allocator<wasm::(anonymous_namespace)::RefCastInfo>::allocator(this_00);
  std::
  vector<wasm::(anonymous_namespace)::RefCastInfo,_std::allocator<wasm::(anonymous_namespace)::RefCastInfo>_>
  ::vector(&this->currRefCastMove,sVar1,this_00);
  std::allocator<wasm::(anonymous_namespace)::RefCastInfo>::~allocator
            ((allocator<wasm::(anonymous_namespace)::RefCastInfo> *)((long)&dummyRefCast.ref + 3));
  sVar1 = Function::getNumLocals(func);
  this_01 = (allocator<wasm::(anonymous_namespace)::RefAsInfo> *)((long)&dummyRefCast.ref + 2);
  std::allocator<wasm::(anonymous_namespace)::RefAsInfo>::allocator(this_01);
  std::
  vector<wasm::(anonymous_namespace)::RefAsInfo,_std::allocator<wasm::(anonymous_namespace)::RefAsInfo>_>
  ::vector(&this->currRefAsMove,sVar1,this_01);
  std::allocator<wasm::(anonymous_namespace)::RefAsInfo>::~allocator
            ((allocator<wasm::(anonymous_namespace)::RefAsInfo> *)((long)&dummyRefCast.ref + 2));
  EffectAnalyzer::EffectAnalyzer(&this->testRefCast,options,module);
  EffectAnalyzer::EffectAnalyzer(&this->testRefAs,options,module);
  std::
  unordered_map<wasm::LocalGet_*,_wasm::RefCast_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefCast_*>_>_>
  ::unordered_map(&this->refCastToApply);
  std::
  unordered_map<wasm::LocalGet_*,_wasm::RefAs_*,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>_>
  ::unordered_map(&this->refAsToApply);
  RefCast::RefCast((RefCast *)&dummyRefAs.value,&module->allocator);
  RefAs::RefAs((RefAs *)local_70,&module->allocator);
  dummyRefAs.super_SpecificExpression<(wasm::Expression::Id)81>.super_Expression.type.id._0_4_ = 0;
  EffectAnalyzer::visit(&this->testRefCast,(Expression *)&dummyRefAs.value);
  EffectAnalyzer::visit(&this->testRefAs,(Expression *)local_70);
  return;
}

Assistant:

EarlyCastFinder(PassOptions options, Module* module, Function* func)
    : options(options), numLocals(func->getNumLocals()),
      currRefCastMove(func->getNumLocals()),
      currRefAsMove(func->getNumLocals()), testRefCast(options, *module),
      testRefAs(options, *module) {

    // TODO: generalize this when we handle more than RefAsNonNull.
    RefCast dummyRefCast(module->allocator);
    RefAs dummyRefAs(module->allocator);
    dummyRefAs.op = RefAsNonNull;

    testRefCast.visit(&dummyRefCast);
    testRefAs.visit(&dummyRefAs);
  }